

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeMovetoUnpacked
              (BtCursor *pCur,UnpackedRecord *pIdxKey,i64 intKey,int biasRight,int *pRes)

{
  uchar *puVar1;
  byte bVar2;
  u8 uVar3;
  ushort uVar4;
  ushort uVar5;
  KeyInfo *pKVar6;
  MemPage *pMVar7;
  u8 *puVar8;
  u8 *puVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  u32 uVar13;
  byte *pbVar14;
  uchar *pBuf;
  ulong uVar15;
  uint uVar16;
  u8 *p;
  uint uVar17;
  uint uVar18;
  bool bVar19;
  code *local_88;
  i64 nCellKey;
  
  if (pIdxKey == (UnpackedRecord *)0x0) {
    if ((pCur->eState == '\0') && ((pCur->curFlags & 2) != 0)) {
      lVar10 = (pCur->info).nKey;
      if (lVar10 == intKey) {
        *pRes = 0;
        return 0;
      }
      if (lVar10 < intKey) {
        if ((pCur->curFlags & 8) != 0) goto LAB_0016ce07;
        if (lVar10 + 1 == intKey) {
          *pRes = 0;
          iVar11 = sqlite3BtreeNext(pCur,0);
          if (iVar11 != 0x65) {
            if (iVar11 != 0) {
              return iVar11;
            }
            getCellInfo(pCur);
            if ((pCur->info).nKey == intKey) {
              return 0;
            }
          }
        }
      }
    }
    local_88 = (code *)0x0;
  }
  else {
    pKVar6 = pIdxKey->pKeyInfo;
    local_88 = sqlite3VdbeRecordCompare;
    if (pKVar6->nAllField < 0xe) {
      uVar4 = pIdxKey->aMem->flags;
      bVar19 = *pKVar6->aSortOrder == '\0';
      pIdxKey->r1 = -bVar19 | 1;
      pIdxKey->r2 = -!bVar19 | 1;
      if ((uVar4 & 4) == 0) {
        if (((uVar4 & 0x39) == 0) &&
           (local_88 = sqlite3VdbeRecordCompare, pKVar6->aColl[0] == (CollSeq *)0x0)) {
          local_88 = vdbeRecordCompareString;
        }
      }
      else {
        local_88 = vdbeRecordCompareInt;
      }
    }
    pIdxKey->errCode = '\0';
  }
  iVar11 = moveToRoot(pCur);
  if (iVar11 != 0x10) {
    if (iVar11 != 0) {
      return iVar11;
    }
LAB_0016caa9:
    pMVar7 = pCur->pPage;
    uVar4 = pMVar7->nCell;
    iVar11 = uVar4 - 1;
    uVar18 = iVar11 >> (1U - (char)biasRight & 0x1f);
    pCur->ix = (u16)uVar18;
    if (local_88 == (code *)0x0) {
      puVar8 = pMVar7->aDataOfst;
      uVar5 = pMVar7->maskPage;
      puVar9 = pMVar7->aCellIdx;
      uVar3 = pMVar7->intKeyLeaf;
      uVar17 = 0;
      do {
        p = puVar8 + (CONCAT11(puVar9[(long)(int)uVar18 * 2],puVar9[(long)(int)uVar18 * 2 + 1]) &
                     uVar5);
        if (uVar3 != '\0') {
          while ((char)*p < '\0') {
            p = p + 1;
            if (pMVar7->aDataEnd <= p) {
              iVar11 = sqlite3CorruptError(0x10c69);
              return iVar11;
            }
          }
          p = p + 1;
        }
        sqlite3GetVarint(p,(u64 *)&nCellKey);
        if (nCellKey < intKey) {
          uVar17 = uVar18 + 1;
          if (iVar11 <= (int)uVar18) goto LAB_0016cce0;
        }
        else {
          if (nCellKey <= intKey) {
            pCur->ix = (u16)uVar18;
            if (pMVar7->leaf != '\0') {
              pCur->curFlags = pCur->curFlags | 2;
              (pCur->info).nKey = nCellKey;
              (pCur->info).nSize = 0;
              *pRes = 0;
              return 0;
            }
            goto LAB_0016cd1e;
          }
          if ((int)uVar18 <= (int)uVar17) {
            iVar12 = 1;
            goto LAB_0016cd09;
          }
          iVar11 = uVar18 - 1;
        }
        uVar18 = (int)(uVar17 + iVar11) >> 1;
      } while( true );
    }
    uVar17 = 0;
    do {
      puVar8 = pMVar7->aDataOfst;
      uVar15 = (ulong)(CONCAT11(pMVar7->aCellIdx[(long)(int)uVar18 * 2],
                                pMVar7->aCellIdx[(long)(int)uVar18 * 2 + 1]) & pMVar7->maskPage);
      pbVar14 = puVar8 + uVar15 + 1;
      bVar2 = puVar8[uVar15];
      uVar16 = (uint)bVar2;
      if (pMVar7->max1bytePayload < bVar2) {
        if ((-1 < (char)*pbVar14) &&
           (uVar16 = (bVar2 & 0x7f) << 7 | (int)(char)*pbVar14, uVar16 <= pMVar7->maxLocal)) {
          pbVar14 = puVar8 + uVar15 + 2;
          goto LAB_0016cbf7;
        }
        (*pMVar7->xParseCell)(pMVar7,puVar8 + (uVar15 - pMVar7->childPtrSize),&pCur->info);
        uVar15 = (pCur->info).nKey;
        uVar13 = (u32)uVar15;
        if (((int)uVar13 < 2) ||
           (pCur->pBt->nPage < (uint)((uVar15 & 0xffffffff) / (ulong)pCur->pBt->usableSize))) {
          iVar11 = 0x10cb4;
LAB_0016cdbb:
          iVar12 = sqlite3CorruptError(iVar11);
        }
        else {
          pBuf = (uchar *)sqlite3Malloc((ulong)(uVar13 + 0x12));
          if (pBuf == (uchar *)0x0) {
            iVar12 = 7;
          }
          else {
            pCur->ix = (u16)uVar18;
            iVar12 = accessPayload(pCur,0,uVar13,pBuf,0);
            puVar1 = pBuf + (uVar13 & 0x7fffffff);
            puVar1[0] = '\0';
            puVar1[1] = '\0';
            puVar1[2] = '\0';
            puVar1[3] = '\0';
            puVar1[4] = '\0';
            puVar1[5] = '\0';
            puVar1[6] = '\0';
            puVar1[7] = '\0';
            puVar1[8] = '\0';
            puVar1[9] = '\0';
            puVar1[10] = '\0';
            puVar1[0xb] = '\0';
            puVar1[0xc] = '\0';
            puVar1[0xd] = '\0';
            puVar1[0xe] = '\0';
            puVar1[0xf] = '\0';
            (pBuf + (ulong)(uVar13 & 0x7fffffff) + 0x10)[0] = '\0';
            (pBuf + (ulong)(uVar13 & 0x7fffffff) + 0x10)[1] = '\0';
            pCur->curFlags = pCur->curFlags & 0xfb;
            if (iVar12 == 0) {
              iVar12 = sqlite3VdbeRecordCompare(uVar13,pBuf,pIdxKey);
              sqlite3_free(pBuf);
              goto LAB_0016cc00;
            }
            sqlite3_free(pBuf);
          }
        }
        goto LAB_0016ce31;
      }
LAB_0016cbf7:
      iVar12 = (*local_88)(uVar16,pbVar14,pIdxKey);
LAB_0016cc00:
      if (iVar12 < 0) {
        uVar17 = uVar18 + 1;
      }
      else {
        if (iVar12 == 0) {
          *pRes = 0;
          pCur->ix = (u16)uVar18;
          if (pIdxKey->errCode != '\0') {
            iVar11 = 0x10cd4;
            goto LAB_0016cdbb;
          }
          goto LAB_0016ce2f;
        }
        iVar11 = uVar18 - 1;
      }
      if (iVar11 < (int)uVar17) goto LAB_0016cd09;
      uVar18 = iVar11 + uVar17 >> 1;
    } while( true );
  }
LAB_0016ce07:
  *pRes = -1;
  return 0;
LAB_0016cce0:
  iVar12 = -1;
LAB_0016cd09:
  if (pMVar7->leaf != '\0') {
    pCur->ix = (u16)uVar18;
    *pRes = iVar12;
LAB_0016ce2f:
    iVar12 = 0;
    goto LAB_0016ce31;
  }
  uVar4 = pMVar7->nCell;
  uVar18 = uVar17;
LAB_0016cd1e:
  if ((int)uVar18 < (int)(uint)uVar4) {
    uVar15 = (ulong)(CONCAT11(pMVar7->aCellIdx[(long)(int)uVar18 * 2],
                              pMVar7->aCellIdx[(long)(int)uVar18 * 2 + 1]) & pMVar7->maskPage);
  }
  else {
    uVar15 = (ulong)pMVar7->hdrOffset + 8;
  }
  uVar13 = sqlite3Get4byte(pMVar7->aData + uVar15);
  pCur->ix = (u16)uVar18;
  iVar12 = moveToChild(pCur,uVar13);
  if (iVar12 != 0) {
LAB_0016ce31:
    (pCur->info).nSize = 0;
    return iVar12;
  }
  goto LAB_0016caa9;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeMovetoUnpacked(
  BtCursor *pCur,          /* The cursor to be moved */
  UnpackedRecord *pIdxKey, /* Unpacked index key */
  i64 intKey,              /* The table key */
  int biasRight,           /* If true, bias the search to the high end */
  int *pRes                /* Write search results here */
){
  int rc;
  RecordCompare xRecordCompare;

  assert( cursorOwnsBtShared(pCur) );
  assert( sqlite3_mutex_held(pCur->pBtree->db->mutex) );
  assert( pRes );
  assert( (pIdxKey==0)==(pCur->pKeyInfo==0) );
  assert( pCur->eState!=CURSOR_VALID || (pIdxKey==0)==(pCur->curIntKey!=0) );

  /* If the cursor is already positioned at the point we are trying
  ** to move to, then just return without doing any work */
  if( pIdxKey==0
   && pCur->eState==CURSOR_VALID && (pCur->curFlags & BTCF_ValidNKey)!=0
  ){
    if( pCur->info.nKey==intKey ){
      *pRes = 0;
      return SQLITE_OK;
    }
    if( pCur->info.nKey<intKey ){
      if( (pCur->curFlags & BTCF_AtLast)!=0 ){
        *pRes = -1;
        return SQLITE_OK;
      }
      /* If the requested key is one more than the previous key, then
      ** try to get there using sqlite3BtreeNext() rather than a full
      ** binary search.  This is an optimization only.  The correct answer
      ** is still obtained without this case, only a little more slowely */
      if( pCur->info.nKey+1==intKey ){
        *pRes = 0;
        rc = sqlite3BtreeNext(pCur, 0);
        if( rc==SQLITE_OK ){
          getCellInfo(pCur);
          if( pCur->info.nKey==intKey ){
            return SQLITE_OK;
          }
        }else if( rc==SQLITE_DONE ){
          rc = SQLITE_OK;
        }else{
          return rc;
        }
      }
    }
  }

  if( pIdxKey ){
    xRecordCompare = sqlite3VdbeFindCompare(pIdxKey);
    pIdxKey->errCode = 0;
    assert( pIdxKey->default_rc==1 
         || pIdxKey->default_rc==0 
         || pIdxKey->default_rc==-1
    );
  }else{
    xRecordCompare = 0; /* All keys are integers */
  }

  rc = moveToRoot(pCur);
  if( rc ){
    if( rc==SQLITE_EMPTY ){
      assert( pCur->pgnoRoot==0 || pCur->pPage->nCell==0 );
      *pRes = -1;
      return SQLITE_OK;
    }
    return rc;
  }
  assert( pCur->pPage );
  assert( pCur->pPage->isInit );
  assert( pCur->eState==CURSOR_VALID );
  assert( pCur->pPage->nCell > 0 );
  assert( pCur->iPage==0 || pCur->apPage[0]->intKey==pCur->curIntKey );
  assert( pCur->curIntKey || pIdxKey );
  for(;;){
    int lwr, upr, idx, c;
    Pgno chldPg;
    MemPage *pPage = pCur->pPage;
    u8 *pCell;                          /* Pointer to current cell in pPage */

    /* pPage->nCell must be greater than zero. If this is the root-page
    ** the cursor would have been INVALID above and this for(;;) loop
    ** not run. If this is not the root-page, then the moveToChild() routine
    ** would have already detected db corruption. Similarly, pPage must
    ** be the right kind (index or table) of b-tree page. Otherwise
    ** a moveToChild() or moveToRoot() call would have detected corruption.  */
    assert( pPage->nCell>0 );
    assert( pPage->intKey==(pIdxKey==0) );
    lwr = 0;
    upr = pPage->nCell-1;
    assert( biasRight==0 || biasRight==1 );
    idx = upr>>(1-biasRight); /* idx = biasRight ? upr : (lwr+upr)/2; */
    pCur->ix = (u16)idx;
    if( xRecordCompare==0 ){
      for(;;){
        i64 nCellKey;
        pCell = findCellPastPtr(pPage, idx);
        if( pPage->intKeyLeaf ){
          while( 0x80 <= *(pCell++) ){
            if( pCell>=pPage->aDataEnd ){
              return SQLITE_CORRUPT_PAGE(pPage);
            }
          }
        }
        getVarint(pCell, (u64*)&nCellKey);
        if( nCellKey<intKey ){
          lwr = idx+1;
          if( lwr>upr ){ c = -1; break; }
        }else if( nCellKey>intKey ){
          upr = idx-1;
          if( lwr>upr ){ c = +1; break; }
        }else{
          assert( nCellKey==intKey );
          pCur->ix = (u16)idx;
          if( !pPage->leaf ){
            lwr = idx;
            goto moveto_next_layer;
          }else{
            pCur->curFlags |= BTCF_ValidNKey;
            pCur->info.nKey = nCellKey;
            pCur->info.nSize = 0;
            *pRes = 0;
            return SQLITE_OK;
          }
        }
        assert( lwr+upr>=0 );
        idx = (lwr+upr)>>1;  /* idx = (lwr+upr)/2; */
      }
    }else{
      for(;;){
        int nCell;  /* Size of the pCell cell in bytes */
        pCell = findCellPastPtr(pPage, idx);

        /* The maximum supported page-size is 65536 bytes. This means that
        ** the maximum number of record bytes stored on an index B-Tree
        ** page is less than 16384 bytes and may be stored as a 2-byte
        ** varint. This information is used to attempt to avoid parsing 
        ** the entire cell by checking for the cases where the record is 
        ** stored entirely within the b-tree page by inspecting the first 
        ** 2 bytes of the cell.
        */
        nCell = pCell[0];
        if( nCell<=pPage->max1bytePayload ){
          /* This branch runs if the record-size field of the cell is a
          ** single byte varint and the record fits entirely on the main
          ** b-tree page.  */
          testcase( pCell+nCell+1==pPage->aDataEnd );
          c = xRecordCompare(nCell, (void*)&pCell[1], pIdxKey);
        }else if( !(pCell[1] & 0x80) 
          && (nCell = ((nCell&0x7f)<<7) + pCell[1])<=pPage->maxLocal
        ){
          /* The record-size field is a 2 byte varint and the record 
          ** fits entirely on the main b-tree page.  */
          testcase( pCell+nCell+2==pPage->aDataEnd );
          c = xRecordCompare(nCell, (void*)&pCell[2], pIdxKey);
        }else{
          /* The record flows over onto one or more overflow pages. In
          ** this case the whole cell needs to be parsed, a buffer allocated
          ** and accessPayload() used to retrieve the record into the
          ** buffer before VdbeRecordCompare() can be called. 
          **
          ** If the record is corrupt, the xRecordCompare routine may read
          ** up to two varints past the end of the buffer. An extra 18 
          ** bytes of padding is allocated at the end of the buffer in
          ** case this happens.  */
          void *pCellKey;
          u8 * const pCellBody = pCell - pPage->childPtrSize;
          const int nOverrun = 18;  /* Size of the overrun padding */
          pPage->xParseCell(pPage, pCellBody, &pCur->info);
          nCell = (int)pCur->info.nKey;
          testcase( nCell<0 );   /* True if key size is 2^32 or more */
          testcase( nCell==0 );  /* Invalid key size:  0x80 0x80 0x00 */
          testcase( nCell==1 );  /* Invalid key size:  0x80 0x80 0x01 */
          testcase( nCell==2 );  /* Minimum legal index key size */
          if( nCell<2 || nCell/pCur->pBt->usableSize>pCur->pBt->nPage ){
            rc = SQLITE_CORRUPT_PAGE(pPage);
            goto moveto_finish;
          }
          pCellKey = sqlite3Malloc( nCell+nOverrun );
          if( pCellKey==0 ){
            rc = SQLITE_NOMEM_BKPT;
            goto moveto_finish;
          }
          pCur->ix = (u16)idx;
          rc = accessPayload(pCur, 0, nCell, (unsigned char*)pCellKey, 0);
          memset(((u8*)pCellKey)+nCell,0,nOverrun); /* Fix uninit warnings */
          pCur->curFlags &= ~BTCF_ValidOvfl;
          if( rc ){
            sqlite3_free(pCellKey);
            goto moveto_finish;
          }
          c = sqlite3VdbeRecordCompare(nCell, pCellKey, pIdxKey);
          sqlite3_free(pCellKey);
        }
        assert( 
            (pIdxKey->errCode!=SQLITE_CORRUPT || c==0)
         && (pIdxKey->errCode!=SQLITE_NOMEM || pCur->pBtree->db->mallocFailed)
        );
        if( c<0 ){
          lwr = idx+1;
        }else if( c>0 ){
          upr = idx-1;
        }else{
          assert( c==0 );
          *pRes = 0;
          rc = SQLITE_OK;
          pCur->ix = (u16)idx;
          if( pIdxKey->errCode ) rc = SQLITE_CORRUPT_BKPT;
          goto moveto_finish;
        }
        if( lwr>upr ) break;
        assert( lwr+upr>=0 );
        idx = (lwr+upr)>>1;  /* idx = (lwr+upr)/2 */
      }
    }
    assert( lwr==upr+1 || (pPage->intKey && !pPage->leaf) );
    assert( pPage->isInit );
    if( pPage->leaf ){
      assert( pCur->ix<pCur->pPage->nCell );
      pCur->ix = (u16)idx;
      *pRes = c;
      rc = SQLITE_OK;
      goto moveto_finish;
    }
moveto_next_layer:
    if( lwr>=pPage->nCell ){
      chldPg = get4byte(&pPage->aData[pPage->hdrOffset+8]);
    }else{
      chldPg = get4byte(findCell(pPage, lwr));
    }
    pCur->ix = (u16)lwr;
    rc = moveToChild(pCur, chldPg);
    if( rc ) break;
  }
moveto_finish:
  pCur->info.nSize = 0;
  assert( (pCur->curFlags & BTCF_ValidOvfl)==0 );
  return rc;
}